

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_Server_processSecureChannelMessage
               (UA_Server *server,UA_SecureChannel *channel,UA_MessageType messagetype,
               UA_UInt32 requestId,UA_ByteString *message)

{
  uint uVar1;
  uint uVar2;
  UA_Connection *connection;
  UA_Logger logger;
  char *pcVar3;
  UA_TcpErrorMessage *msg;
  
  if (channel == (UA_SecureChannel *)0x0) {
    __assert_fail("channel",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                  ,0x442a,
                  "void UA_Server_processSecureChannelMessage(UA_Server *, UA_SecureChannel *, UA_MessageType, UA_UInt32, const UA_ByteString *)"
                 );
  }
  connection = channel->connection;
  if (connection == (UA_Connection *)0x0) {
    __assert_fail("channel->connection",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                  ,0x442b,
                  "void UA_Server_processSecureChannelMessage(UA_Server *, UA_SecureChannel *, UA_MessageType, UA_UInt32, const UA_ByteString *)"
                 );
  }
  if (messagetype == UA_MESSAGETYPE_MSG) {
    processMSG(server,channel,requestId,message);
    return;
  }
  if (messagetype != UA_MESSAGETYPE_OPN) {
    if (messagetype != UA_MESSAGETYPE_CLO) {
      if (messagetype == UA_MESSAGETYPE_ERR) {
        logger = (server->config).logger;
        uVar1 = connection->sockfd;
        uVar2 = (channel->securityToken).channelId;
        pcVar3 = UA_StatusCode_name((UA_StatusCode)message->length);
        UA_LOG_ERROR(logger,UA_LOGCATEGORY_SECURECHANNEL,
                     "Connection %i | SecureChannel %i | Client replied with an error message: %s %.*s"
                     ,(ulong)uVar1,(ulong)uVar2,pcVar3,*(undefined4 *)&message->data,
                     (int)message[1].length);
      }
      return;
    }
    Service_CloseSecureChannel(server,channel);
    return;
  }
  processOPN(server,connection,(channel->securityToken).channelId,message);
  return;
}

Assistant:

static void
UA_Server_processSecureChannelMessage(UA_Server *server, UA_SecureChannel *channel,
                                      UA_MessageType messagetype, UA_UInt32 requestId,
                                      const UA_ByteString *message) {
    UA_assert(channel);
    UA_assert(channel->connection);
    switch(messagetype) {
    case UA_MESSAGETYPE_ERR: {
        const UA_TcpErrorMessage *msg = (const UA_TcpErrorMessage *) message;
        UA_LOG_ERROR_CHANNEL(server->config.logger, channel,
                             "Client replied with an error message: %s %.*s",
                             UA_StatusCode_name(msg->error), msg->reason.length, msg->reason.data);
        break;
    }
    case UA_MESSAGETYPE_HEL:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Cannot process a HEL on an open channel");
        break;
    case UA_MESSAGETYPE_OPN:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Process an OPN on an open channel");
        processOPN(server, channel->connection, channel->securityToken.channelId, message);
        break;
    case UA_MESSAGETYPE_MSG:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Process a MSG", channel->connection->sockfd);
        processMSG(server, channel, requestId, message);
        break;
    case UA_MESSAGETYPE_CLO:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Process a CLO", channel->connection->sockfd);
        Service_CloseSecureChannel(server, channel);
        break;
    default:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Unknown message type");
    }
}